

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_array_getFirstElements(sysbvm_context_t *context,sysbvm_tuple_t array,size_t size)

{
  _Bool _Var1;
  sysbvm_array_t *local_48;
  size_t i;
  sysbvm_array_t *result;
  sysbvm_array_t *source;
  size_t resultSize;
  size_t size_local;
  sysbvm_tuple_t array_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(array);
  if (_Var1) {
    source = (sysbvm_array_t *)sysbvm_tuple_getSizeInSlots(array);
    if (size < source) {
      source = (sysbvm_array_t *)size;
    }
    context_local = (sysbvm_context_t *)sysbvm_array_create(context,(sysbvm_tuple_t)source);
    for (local_48 = (sysbvm_array_t *)0x0; local_48 < source;
        local_48 = (sysbvm_array_t *)((long)&(local_48->header).field_0 + 1)) {
      *(undefined8 *)(&(context_local->heap).shouldAttemptToCollect + (long)local_48 * 8) =
           *(undefined8 *)(array + 0x10 + (long)local_48 * 8);
    }
  }
  else {
    context_local = (sysbvm_context_t *)0x0;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_array_getFirstElements(sysbvm_context_t *context, sysbvm_tuple_t array, size_t size)
{
    if(!sysbvm_tuple_isNonNullPointer(array)) return SYSBVM_NULL_TUPLE;

    size_t resultSize = sysbvm_tuple_getSizeInSlots(array);
    if(size < resultSize)
        resultSize = size;

    sysbvm_array_t *source = (sysbvm_array_t*)array;
    sysbvm_array_t *result = (sysbvm_array_t*)sysbvm_array_create(context, resultSize);
    for(size_t i = 0; i < resultSize; ++i)
        result->elements[i] = source->elements[i];

    return (sysbvm_tuple_t)result;
}